

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_linux_string.c
# Opt level: O3

void test_cio_strncasecmp(void)

{
  int iVar1;
  
  iVar1 = cio_strncasecmp("Hello World!","HELLO",5);
  UnityAssertEqualNumber
            (0,(long)iVar1,"String s2 not found in s1 after ignoring case!",0x40,
             UNITY_DISPLAY_STYLE_INT);
  iVar1 = cio_strncasecmp("Hello World!","Hello",5);
  UnityAssertEqualNumber
            (0,(long)iVar1,"String s3 not found in s1 after ignoring case!",0x44,
             UNITY_DISPLAY_STYLE_INT);
  iVar1 = cio_strncasecmp("Hello World!","World",5);
  if (iVar1 != 0) {
    return;
  }
  UnityFail("String s4 found in s1 after ignoring case!",0x48);
}

Assistant:

static void test_cio_strncasecmp(void)
{
	const char *s1 = "Hello World!";
	const char *s2 = "HELLO";
	int ret = cio_strncasecmp(s1, s2, strlen(s2));
	TEST_ASSERT_EQUAL_MESSAGE(0, ret, "String s2 not found in s1 after ignoring case!");

	const char *s3 = "Hello";
	ret = cio_strncasecmp(s1, s3, strlen(s3));
	TEST_ASSERT_EQUAL_MESSAGE(0, ret, "String s3 not found in s1 after ignoring case!");

	const char *s4 = "World";
	ret = cio_strncasecmp(s1, s4, strlen(s4));
	TEST_ASSERT_NOT_EQUAL_MESSAGE(0, ret, "String s4 found in s1 after ignoring case!");
}